

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey
          (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this,FModelVertex key)

{
  Node *pNVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  uint uVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  
  pNVar6 = this->Nodes;
  uVar9 = this->Size - 1;
  uVar7 = SUB84((double)key.z + 6755399441055744.0,0) * 0x40000 +
          SUB84((double)key.y + 6755399441055744.0,0) * 0x200 +
          SUB84((double)key.x + 6755399441055744.0,0) & uVar9;
  pNVar12 = pNVar6 + uVar7;
  pNVar8 = pNVar6[uVar7].Next;
  if (pNVar8 == (Node *)0x1) {
    pNVar12->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar10 = pNVar1 + -1;
      pNVar11 = (Node *)0x0;
      if (pNVar1 <= pNVar6) break;
      pNVar11 = pNVar10;
      pNVar1 = pNVar10;
    } while (pNVar10->Next != (Node *)0x1);
    this->LastFree = pNVar10;
    if (pNVar11 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar6 = NewKey(this,key);
    }
    else {
      uVar9 = SUB84((double)(pNVar12->Pair).Key.z + 6755399441055744.0,0) * 0x40000 +
              SUB84((double)(pNVar12->Pair).Key.y + 6755399441055744.0,0) * 0x200 +
              SUB84((double)(pNVar12->Pair).Key.x + 6755399441055744.0,0) & uVar9;
      if (uVar9 == uVar7) {
        pNVar11->Next = pNVar8;
        pNVar6 = pNVar11;
        pNVar8 = pNVar11;
      }
      else {
        pNVar6 = pNVar6 + uVar9;
        do {
          pNVar8 = pNVar6;
          pNVar6 = pNVar8->Next;
        } while (pNVar6 != pNVar12);
        pNVar8->Next = pNVar11;
        pNVar6 = pNVar12->Next;
        fVar4 = (pNVar12->Pair).Key.x;
        fVar5 = (pNVar12->Pair).Key.y;
        fVar3 = (pNVar12->Pair).Key.u;
        uVar2 = *(undefined8 *)&(pNVar12->Pair).Key.v;
        (pNVar11->Pair).Key.z = (pNVar12->Pair).Key.z;
        (pNVar11->Pair).Key.u = fVar3;
        *(undefined8 *)&(pNVar11->Pair).Key.v = uVar2;
        pNVar11->Next = pNVar6;
        (pNVar11->Pair).Key.x = fVar4;
        (pNVar11->Pair).Key.y = fVar5;
        pNVar6 = (Node *)0x0;
        pNVar8 = pNVar12;
      }
      pNVar12->Next = pNVar6;
      pNVar12 = pNVar8;
    }
    if (pNVar11 == (Node *)0x0) {
      return pNVar6;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar12->Pair).Key.v = key.v;
  (pNVar12->Pair).Key.x = (float)(int)key._0_8_;
  (pNVar12->Pair).Key.y = (float)(int)((ulong)key._0_8_ >> 0x20);
  (pNVar12->Pair).Key.z = (float)(int)key._8_8_;
  (pNVar12->Pair).Key.u = (float)(int)((ulong)key._8_8_ >> 0x20);
  return pNVar12;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}